

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

ull getbf(bitfield *bf,ull *a,ull *m,disctx *ctx)

{
  ull uVar1;
  byte bVar2;
  long in_RCX;
  ull *in_RDX;
  ull *in_RSI;
  long in_RDI;
  int i;
  int pos;
  ull res;
  uint local_30;
  int local_2c;
  ulong local_28;
  
  local_28 = 0;
  local_2c = *(int *)(in_RDI + 0x14);
  for (local_30 = 0; bVar2 = (byte)local_2c, local_30 < 2; local_30 = local_30 + 1) {
    uVar1 = bf_(*(int *)(in_RDI + (long)(int)local_30 * 8),
                *(int *)(in_RDI + 4 + (long)(int)local_30 * 8),in_RSI,in_RDX);
    local_28 = uVar1 << (bVar2 & 0x3f) | local_28;
    local_2c = *(int *)(in_RDI + 4 + (long)(int)local_30 * 8) + local_2c;
  }
  switch(*(undefined4 *)(in_RDI + 0x10)) {
  case 0:
    break;
  case 1:
    if ((local_28 & 1L << (bVar2 - 1 & 0x3f)) != 0) {
      local_28 = local_28 - (1L << (bVar2 & 0x3f));
    }
    break;
  case 2:
    if (((local_28 & 1L << (bVar2 - 1 & 0x3f)) != 0) && ((local_28 & 1L << (bVar2 - 2 & 0x3f)) != 0)
       ) {
      local_28 = local_28 - (1L << (bVar2 & 0x3f));
    }
    break;
  case 3:
    local_28 = local_28 - (1L << (bVar2 & 0x3f));
    break;
  case 4:
    local_28 = *(ulong *)(*(long *)(in_RDI + 0x38) + local_28 * 8);
  }
  if (*(int *)(in_RDI + 0x18) != 0) {
    local_28 = ((ulong)*(uint *)(in_RCX + 0x44) + *(long *)(in_RDI + 0x30) &
               -(1L << ((byte)*(undefined4 *)(in_RDI + 0x14) & 0x3f))) + local_28;
  }
  return *(long *)(in_RDI + 0x28) + (*(ulong *)(in_RDI + 0x20) ^ local_28);
}

Assistant:

ull getbf(const struct bitfield *bf, ull *a, ull *m, struct disctx *ctx) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	if (bf->pcrel) {
		// <3 xtensa.
		res += (ctx->pos + bf->pospreadd) & -(1ull << bf->shr);
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}